

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

uint32_t vkb::detail::get_present_queue_index
                   (VkPhysicalDevice phys_device,VkSurfaceKHR surface,
                   vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                   *families)

{
  VkResult VVar1;
  size_type sVar2;
  VulkanFunctions *pVVar3;
  VkBool32 local_30;
  VkResult res;
  VkBool32 presentSupport;
  uint32_t i;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *families_local;
  VkSurfaceKHR surface_local;
  VkPhysicalDevice phys_device_local;
  
  res = VK_SUCCESS;
  _presentSupport = families;
  families_local =
       (vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)surface;
  surface_local = (VkSurfaceKHR)phys_device;
  while( true ) {
    VVar1 = res;
    sVar2 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::size
                      (_presentSupport);
    if ((uint)(VkResult)sVar2 <= (uint)VVar1) {
      return 0xffffffff;
    }
    local_30 = 0;
    if (families_local !=
        (vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)0x0) {
      pVVar3 = vulkan_functions();
      VVar1 = (*pVVar3->fp_vkGetPhysicalDeviceSurfaceSupportKHR)
                        ((VkPhysicalDevice)surface_local,res,(VkSurfaceKHR)families_local,&local_30)
      ;
      if (VVar1 != VK_SUCCESS) {
        return 0xffffffff;
      }
    }
    if (local_30 == 1) break;
    res = res + VK_NOT_READY;
  }
  return res;
}

Assistant:

uint32_t get_present_queue_index(
    VkPhysicalDevice const phys_device, VkSurfaceKHR const surface, std::vector<VkQueueFamilyProperties> const& families) {
    for (uint32_t i = 0; i < static_cast<uint32_t>(families.size()); i++) {
        VkBool32 presentSupport = VK_FALSE;
        if (surface != VK_NULL_HANDLE) {
            VkResult res = detail::vulkan_functions().fp_vkGetPhysicalDeviceSurfaceSupportKHR(phys_device, i, surface, &presentSupport);
            if (res != VK_SUCCESS) return QUEUE_INDEX_MAX_VALUE; // TODO: determine if this should fail another way
        }
        if (presentSupport == VK_TRUE) return i;
    }
    return QUEUE_INDEX_MAX_VALUE;
}